

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool system_input(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_value_t value;
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  gravity_value_t local_448;
  char local_438 [8];
  char buffer [1024];
  _Bool remove_trailing;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  bVar3 = true;
  if ((1 < nargs) && (args[1].isa == gravity_class_bool)) {
    bVar3 = args[1].field_1.n != 0;
  }
  pcVar1 = fgets(local_438,0x400,_stdin);
  if (pcVar1 == (char *)0x0) {
    value.field_1.n = 0;
    value.isa = gravity_class_null;
    gravity_vm_setslot(vm,value,rindex);
  }
  else {
    if (bVar3) {
      sVar2 = strlen(local_438);
      *(undefined1 *)((long)&local_448.field_1 + sVar2 + 7) = 0;
    }
    local_448 = gravity_string_to_value(vm,local_438,0xffffffff);
    gravity_vm_setslot(vm,local_448,rindex);
  }
  return true;
}

Assistant:

static bool system_input (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    // optional argument is a boolean flag
    bool remove_trailing = true;
    if (nargs >= 2 && VALUE_ISA_BOOL(GET_VALUE(1))) remove_trailing = VALUE_AS_BOOL(GET_VALUE(1));
    
    char buffer[1024];
    if (fgets(buffer, sizeof(buffer), stdin) != NULL) {
        // remove trailing newline captured by fgets (default true)
        if (remove_trailing) buffer[strlen(buffer) - 1] = 0;
        RETURN_VALUE(VALUE_FROM_CSTRING(vm, buffer), rindex);
    }
    
    RETURN_VALUE(VALUE_FROM_NULL, rindex);
}